

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

FString SubstituteAliasParams(FString *command,FCommandLine *args)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  FCommandLine *in_RDX;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *start;
  char *local_40;
  FCommandLine *local_38;
  
  local_38 = in_RDX;
  pcVar4 = FString::LockBuffer((FString *)args);
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  command->Chars = (char *)0x723dac;
  bVar2 = false;
  pcVar6 = pcVar4;
  local_40 = pcVar4;
LAB_0035b14f:
  do {
    pcVar7 = pcVar6 + 1;
    pcVar8 = pcVar6;
    for (; cVar1 = pcVar7[-1], cVar1 == '%'; pcVar7 = pcVar7 + 2) {
      cVar1 = *pcVar7;
      if ((cVar1 == '{') || ((byte)(cVar1 - 0x30U) < 10)) {
        FString::AppendCStrPart(command,pcVar4,(long)pcVar8 - (long)pcVar4);
        uVar5 = strtoul(pcVar7 + (*pcVar7 == '{'),&local_40,10);
        if (((*pcVar7 != '{') || (*local_40 == '}')) &&
           (iVar3 = FCommandLine::argc(local_38), uVar5 < (ulong)(long)iVar3)) {
          pcVar4 = FCommandLine::operator[](local_38,(int)uVar5);
          FString::operator+=(command,pcVar4);
        }
        if (*pcVar7 == '{') {
          uVar5 = (ulong)(*local_40 == '}');
        }
        else {
          uVar5 = 0;
        }
        pcVar4 = local_40 + uVar5;
        pcVar6 = pcVar4;
        local_40 = pcVar4;
        goto LAB_0035b14f;
      }
      if (cVar1 != '%') {
        pcVar6 = pcVar7;
        if (cVar1 != '\"') goto LAB_0035b14f;
        if (bVar2) {
          bVar2 = false;
        }
        else {
          FString::AppendCStrPart(command,pcVar4,(long)pcVar8 - (long)pcVar4);
          bVar2 = true;
          pcVar4 = pcVar7;
          local_40 = pcVar7;
        }
        goto LAB_0035b220;
      }
      FString::AppendCStrPart(command,pcVar4,(size_t)(pcVar8 + (1 - (long)pcVar4)));
      pcVar4 = pcVar6 + 2;
      local_40 = pcVar7 + 1;
      pcVar8 = pcVar8 + 2;
      pcVar6 = pcVar4;
    }
    if (cVar1 == '\0') {
      if (pcVar4 < pcVar7 + -1) {
        FString::AppendCStrPart(command,pcVar4,(long)pcVar8 - (long)pcVar4);
      }
      FString::UnlockBuffer((FString *)args);
      return (FString)(char *)command;
    }
    if (cVar1 != '\"') {
      pcVar6 = pcVar7;
      if ((cVar1 == '\\') && (*pcVar7 == '\"')) {
LAB_0035b220:
        pcVar6 = pcVar7 + 1;
      }
      goto LAB_0035b14f;
    }
    if (!bVar2) {
      do {
        cVar1 = *pcVar7;
        if (cVar1 == '\"') {
          if (pcVar7[-1] != '\\') goto LAB_0035b1f8;
        }
        else if (cVar1 == '\0') goto LAB_0035b1f8;
        pcVar7 = pcVar7 + 1;
      } while( true );
    }
    bVar2 = false;
    pcVar6 = pcVar7;
  } while( true );
LAB_0035b1f8:
  pcVar6 = pcVar7;
  if (cVar1 != '\0') {
    pcVar6 = pcVar7 + 1;
  }
  goto LAB_0035b14f;
}

Assistant:

FString SubstituteAliasParams (FString &command, FCommandLine &args)
{
	// Do substitution by replacing %x with the argument x.
	// If there is no argument x, then %x is simply removed.

	// For some reason, strtoul's stop parameter is non-const.
	char *p = command.LockBuffer(), *start = p;
	unsigned long argnum;
	FString buf;
	bool inquote = false;

	while (*p != '\0')
	{
		if (p[0] == '%' && ((p[1] >= '0' && p[1] <= '9') || p[1] == '{'))
		{
			// Do a substitution. Output what came before this.
			buf.AppendCStrPart (start, p - start);

			// Extract the argument number and substitute the corresponding argument.
			argnum = strtoul (p + 1 + (p[1] == '{'), &start, 10);
			if ((p[1] != '{' || *start == '}') && argnum < (unsigned long)args.argc())
			{
				buf += args[argnum];
			}
			p = (start += (p[1] == '{' && *start == '}'));
		}
		else if (p[0] == '%' && p[1] == '%')
		{
			// Do not substitute. Just collapse to a single %.
			buf.AppendCStrPart (start, p - start + 1);
			start = p = p + 2;
			continue;
		}
		else if (p[0] == '%' && p[1] == '"')
		{
			// Collapse %" to " and remember that we're in a quote so when we
			// see a " character again, we don't start skipping below.
			if (!inquote)
			{
				inquote = true;
				buf.AppendCStrPart(start, p - start);
				start = p + 1;
			}
			else
			{
				inquote = false;
			}
			p += 2;
		}
		else if (p[0] == '\\' && p[1] == '"')
		{
			p += 2;
		}
		else if (p[0] == '"')
		{
			// Don't substitute inside quoted strings if it didn't start
			// with a %"
			if (!inquote)
			{
				p++;
				while (*p != '\0' && (*p != '"' || *(p-1) == '\\'))
					p++;
				if (*p != '\0')
					p++;
			}
			else
			{
				inquote = false;
				p++;
			}
		}
		else
		{
			p++;
		}
	}
	// Return whatever was after the final substitution.
	if (p > start)
	{
		buf.AppendCStrPart (start, p - start);
	}
	command.UnlockBuffer();

	return buf;
}